

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlElementType xVar1;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *local_30;
  xmlChar *fullname;
  int i;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  cur._4_4_ = nargs;
  if (nargs == 0) {
    pxVar2 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar2);
    cur._4_4_ = 1;
  }
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (cur._4_4_ == 1) {
      if (ctxt->valueNr < 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
              ((ctxt->value->type != XPATH_NODESET && (ctxt->value->type != XPATH_XSLT_TREE)))) {
        xmlXPathErr(ctxt,0xb);
      }
      else {
        pxVar2 = xmlXPathValuePop(ctxt);
        if ((pxVar2->nodesetval == (xmlNodeSetPtr)0x0) || (pxVar2->nodesetval->nodeNr == 0)) {
          pxVar3 = xmlXPathCacheNewCString(ctxt,"");
          xmlXPathValuePush(ctxt,pxVar3);
        }
        else {
          xVar1 = (*pxVar2->nodesetval->nodeTab)->type;
          if (xVar1 == XML_ELEMENT_NODE || xVar1 == XML_ATTRIBUTE_NODE) {
            if (*(*pxVar2->nodesetval->nodeTab)->name == ' ') {
              pxVar3 = xmlXPathCacheNewCString(ctxt,"");
              xmlXPathValuePush(ctxt,pxVar3);
            }
            else if (((*pxVar2->nodesetval->nodeTab)->ns == (xmlNs *)0x0) ||
                    ((*pxVar2->nodesetval->nodeTab)->ns->prefix == (xmlChar *)0x0)) {
              pxVar3 = xmlXPathCacheNewString(ctxt,(*pxVar2->nodesetval->nodeTab)->name);
              xmlXPathValuePush(ctxt,pxVar3);
            }
            else {
              local_30 = xmlBuildQName((*pxVar2->nodesetval->nodeTab)->name,
                                       (*pxVar2->nodesetval->nodeTab)->ns->prefix,(xmlChar *)0x0,0);
              if (local_30 == (*pxVar2->nodesetval->nodeTab)->name) {
                local_30 = xmlStrdup((*pxVar2->nodesetval->nodeTab)->name);
              }
              if (local_30 == (xmlChar *)0x0) {
                xmlXPathPErrMemory(ctxt);
              }
              pxVar3 = xmlXPathCacheWrapString(ctxt,local_30);
              xmlXPathValuePush(ctxt,pxVar3);
            }
          }
          else {
            pxVar3 = xmlXPathCacheNewNodeSet(ctxt,*pxVar2->nodesetval->nodeTab);
            xmlXPathValuePush(ctxt,pxVar3);
            xmlXPathLocalNameFunction(ctxt,1);
          }
        }
        xmlXPathReleaseObject(ctxt->context,pxVar2);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

static void
xmlXPathNameFunction(xmlXPathParserContextPtr ctxt, int nargs)
{
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
        nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
        ((ctxt->value->type != XPATH_NODESET) &&
         (ctxt->value->type != XPATH_XSLT_TREE)))
        XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
        xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
        int i = 0;              /* Should be first in document order !!!!! */

        switch (cur->nodesetval->nodeTab[i]->type) {
            case XML_ELEMENT_NODE:
            case XML_ATTRIBUTE_NODE:
		if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		    xmlXPathValuePush(ctxt,
			xmlXPathCacheNewCString(ctxt, ""));
		else if ((cur->nodesetval->nodeTab[i]->ns == NULL) ||
                         (cur->nodesetval->nodeTab[i]->ns->prefix == NULL)) {
		    xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			    cur->nodesetval->nodeTab[i]->name));
		} else {
		    xmlChar *fullname;

		    fullname = xmlBuildQName(cur->nodesetval->nodeTab[i]->name,
				     cur->nodesetval->nodeTab[i]->ns->prefix,
				     NULL, 0);
		    if (fullname == cur->nodesetval->nodeTab[i]->name)
			fullname = xmlStrdup(cur->nodesetval->nodeTab[i]->name);
		    if (fullname == NULL)
                        xmlXPathPErrMemory(ctxt);
		    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, fullname));
                }
                break;
            default:
		xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
		    cur->nodesetval->nodeTab[i]));
                xmlXPathLocalNameFunction(ctxt, 1);
        }
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}